

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O3

void __thiscall JPG::quantization(JPG *this)

{
  MCU *pMVar1;
  Block *paiVar2;
  uint uVar3;
  uint uVar4;
  Block **ppaiVar5;
  uint uVar6;
  uint uVar7;
  uint componentID;
  uint ID;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  
  uVar6 = this->mcuHeight;
  if (uVar6 != 0) {
    uVar3 = this->mcuWidth;
    uVar8 = 0;
    do {
      uVar10 = 0;
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          pMVar1 = this->data;
          ID = 1;
          do {
            uVar4 = getVerticalSamplingFrequency(this,ID);
            if (uVar4 != 0) {
              piVar11 = QUANTIZATION_TABLE_CBCR;
              if (ID == 1) {
                piVar11 = QUANTIZATION_TABLE_Y;
              }
              uVar10 = 0;
              do {
                uVar4 = getHorizontalSamplingFrequency(this,ID);
                if (uVar4 != 0) {
                  uVar12 = 0;
                  do {
                    ppaiVar5 = MCU::operator[](pMVar1 + (uVar3 * uVar8 + uVar6),ID);
                    paiVar2 = *ppaiVar5;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                    uVar7 = uVar4 * uVar10 + uVar12;
                    lVar9 = 0;
                    do {
                      paiVar2[uVar7][lVar9] = paiVar2[uVar7][lVar9] / piVar11[lVar9];
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 0x40);
                    uVar12 = uVar12 + 1;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                  } while (uVar12 < uVar4);
                }
                uVar10 = uVar10 + 1;
                uVar4 = getVerticalSamplingFrequency(this,ID);
              } while (uVar10 < uVar4);
            }
            ID = ID + 1;
          } while (ID != 4);
          uVar6 = uVar6 + 1;
          uVar3 = this->mcuWidth;
        } while (uVar6 < uVar3);
        uVar6 = this->mcuHeight;
        uVar10 = uVar3;
      }
      uVar3 = uVar10;
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar6);
  }
  return;
}

Assistant:

void JPG::quantization() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        const Block& quantizationTable = JPG::getQuantizationTableByID(componentID);

                        for(uint index = 0; index < 64; index++) {
                             currentBlock[index] = currentBlock[index] / quantizationTable[index];
                        }
                    }
                }             
            }
        }
    }  
}